

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_read(char *data,uint8_t *buf,size_t count,lyb_state *lybs)

{
  undefined2 uVar1;
  byte local_42;
  uint8_t uStack_41;
  lyb_state *plStack_40;
  uint8_t meta_buf [2];
  size_t to_read;
  int local_30;
  int empty_chunk_i;
  int i;
  int ret;
  lyb_state *lybs_local;
  size_t count_local;
  uint8_t *buf_local;
  char *data_local;
  
  empty_chunk_i = 0;
  if ((data != (char *)0x0) &&
     (lybs_local = (lyb_state *)count, count_local = (size_t)buf, lybs != (lyb_state *)0x0)) {
    while( true ) {
      plStack_40 = lybs_local;
      to_read._4_4_ = -1;
      for (local_30 = 0; local_30 < lybs->used; local_30 = local_30 + 1) {
        if (((lyb_state *)lybs->written[local_30] <= plStack_40) && (lybs->position[local_30] != 0))
        {
          plStack_40 = (lyb_state *)lybs->written[local_30];
          to_read._4_4_ = local_30;
        }
      }
      if ((to_read._4_4_ == -1) && (lybs_local == (lyb_state *)0x0)) break;
      if (plStack_40 != (lyb_state *)0x0) {
        if (count_local != 0) {
          memcpy((void *)count_local,data + empty_chunk_i,(size_t)plStack_40);
        }
        for (local_30 = 0; local_30 < lybs->used; local_30 = local_30 + 1) {
          lybs->written[local_30] = lybs->written[local_30] - (long)plStack_40;
          if (0xff < lybs->written[local_30]) {
            __assert_fail("lybs->written[i] <= LYB_SIZE_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                          ,0x52,"int lyb_read(const char *, uint8_t *, size_t, struct lyb_state *)")
            ;
          }
        }
        lybs_local = (lyb_state *)((long)lybs_local - (long)plStack_40);
        if (count_local != 0) {
          count_local = (long)&plStack_40->written + count_local;
        }
        empty_chunk_i = empty_chunk_i + (int)plStack_40;
      }
      if (-1 < to_read._4_4_) {
        uVar1 = *(undefined2 *)(data + empty_chunk_i);
        local_42 = (byte)uVar1;
        lybs->written[to_read._4_4_] = (ulong)local_42;
        uStack_41 = (uint8_t)((ushort)uVar1 >> 8);
        lybs->inner_chunks[to_read._4_4_] = uStack_41;
        lybs->position[to_read._4_4_] = (long)(int)(uint)(lybs->written[to_read._4_4_] == 0xff);
        empty_chunk_i = empty_chunk_i + 2;
      }
    }
    return empty_chunk_i;
  }
  __assert_fail("data && lybs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                ,0x35,"int lyb_read(const char *, uint8_t *, size_t, struct lyb_state *)");
}

Assistant:

static int
lyb_read(const char *data, uint8_t *buf, size_t count, struct lyb_state *lybs)
{
    int ret = 0, i, empty_chunk_i;
    size_t to_read;
    uint8_t meta_buf[LYB_META_BYTES];

    assert(data && lybs);

    while (1) {
        /* check for fully-read (empty) data chunks */
        to_read = count;
        empty_chunk_i = -1;
        for (i = 0; i < lybs->used; ++i) {
            /* we want the innermost chunks resolved first, so replace previous empty chunks,
             * also ignore chunks that are completely finished, there is nothing for us to do */
            if ((lybs->written[i] <= to_read) && lybs->position[i]) {
                /* empty chunk, do not read more */
                to_read = lybs->written[i];
                empty_chunk_i = i;
            }
        }

        if ((empty_chunk_i == -1) && !count) {
            break;
        }

        /* we are actually reading some data, not just finishing another chunk */
        if (to_read) {
            if (buf) {
                memcpy(buf, data + ret, to_read);
            }

            for (i = 0; i < lybs->used; ++i) {
                /* decrease all written counters */
                lybs->written[i] -= to_read;
                assert(lybs->written[i] <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_read;
            if (buf) {
                buf += to_read;
            }

            ret += to_read;
        }

        if (empty_chunk_i > -1) {
            /* read the next chunk meta information */
            memcpy(meta_buf, data + ret, LYB_META_BYTES);
            lybs->written[empty_chunk_i] = meta_buf[0];
            lybs->inner_chunks[empty_chunk_i] = meta_buf[1];

            /* remember whether there is a following chunk or not */
            lybs->position[empty_chunk_i] = (lybs->written[empty_chunk_i] == LYB_SIZE_MAX ? 1 : 0);

            ret += LYB_META_BYTES;
        }
    }

    return ret;
}